

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_>::Print
          (TPZFrontMatrix<float,_TPZFileEqnStorage<float>,_TPZFrontNonSym<float>_> *this,char *name,
          ostream *out,MatrixOutputFormat form)

{
  ostream *poVar1;
  long lVar2;
  
  poVar1 = std::operator<<(out,"Frontal Matrix associated");
  std::endl<char,std::char_traits<char>>(poVar1);
  TPZFrontNonSym<float>::Print(&this->fFront,name,out);
  poVar1 = std::operator<<(out,"Stored Equations");
  std::endl<char,std::char_traits<char>>(poVar1);
  TPZFileEqnStorage<float>::Print(&this->fStorage,name,out);
  poVar1 = std::operator<<(out,"Number of Equations ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"Number of Elements connected to DF");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (lVar2 = 0; lVar2 < (this->fNumElConnected).fNElements; lVar2 = lVar2 + 1) {
    poVar1 = std::ostream::_M_insert<long>((long)out);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->fNumElConnected).fStore[lVar2]);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void TPZFrontMatrix<TVar,store, front>::Print(const char *name, std::ostream& out,const MatrixOutputFormat form) const
{
	int64_t i;
	out << "Frontal Matrix associated"<< endl;
	fFront.Print(name, out);
	out << "Stored Equations" << endl;
	fStorage.Print(name, out);
	out << "Number of Equations " << fNumEq << endl;
	out << "Number of Elements connected to DF" << endl;
	for(i=0;i<fNumElConnected.NElements();i++){
		out << i << " " << fNumElConnected[i] << endl;
	}
}